

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

ostream * plot::detail::operator<<(ostream *stream,label_line *line)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ulong uVar2;
  plot *this;
  char *pcVar3;
  char *in_RDX;
  size_t in_R8;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  ulong local_f8;
  ulong local_f0;
  long local_b0;
  size_t padding_right;
  size_t padding_left;
  size_t padding;
  pair<std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
  local_88;
  basic_ostream<char,_std::char_traits<char>_> *local_70;
  char *local_68;
  size_t local_60;
  size_t local_58;
  char *local_50;
  size_t width;
  char *local_40;
  char *local_38;
  size_t twidth;
  string_view text;
  label_line *line_local;
  ostream *stream_local;
  
  this = (plot *)(line->label_->text_)._M_len;
  local_40 = (line->label_->text_)._M_str;
  str._M_str = in_RDX;
  str._M_len = (size_t)local_40;
  width = (size_t)this;
  twidth = (size_t)this;
  text._M_len = (size_t)local_40;
  text._M_str = (char *)line;
  local_38 = (char *)utf8_string_width(this,str);
  pcVar3 = *(char **)(*(long *)text._M_str + 0x18);
  local_50 = pcVar3;
  if ((pcVar3 == (char *)0x0) || (local_38 == pcVar3)) {
    local_60 = twidth;
    local_58 = text._M_len;
    __str._M_str = (char *)this;
    __str._M_len = text._M_len;
    stream_local = std::experimental::fundamentals_v1::operator<<
                             ((fundamentals_v1 *)stream,
                              (basic_ostream<char,_std::char_traits<char>_> *)twidth,__str);
  }
  else if (pcVar3 < local_38) {
    str_00._M_str = pcVar3;
    str_00._M_len = text._M_len;
    utf8_clamp(&local_88,(plot *)twidth,str_00,in_R8);
    local_70 = (basic_ostream<char,_std::char_traits<char>_> *)local_88.first._M_len;
    local_68 = local_88.first._M_str;
    __str_00._M_str = pcVar3;
    __str_00._M_len = (size_t)local_88.first._M_str;
    stream_local = std::experimental::fundamentals_v1::operator<<
                             ((fundamentals_v1 *)stream,
                              (basic_ostream<char,_std::char_traits<char>_> *)local_88.first._M_len,
                              __str_00);
  }
  else {
    uVar2 = (long)pcVar3 - (long)local_38;
    if (*(int *)(*(long *)text._M_str + 0x10) == 1) {
      local_f0 = uVar2 >> 1;
    }
    else {
      local_f8 = uVar2;
      if (*(int *)(*(long *)text._M_str + 0x10) != 2) {
        local_f8 = 0;
      }
      local_f0 = local_f8;
    }
    padding_right = local_f0;
    while (__str_02._M_str = (char *)(padding_right - 1), padding_right != 0) {
      pbVar1 = *(basic_ostream<char,_std::char_traits<char>_> **)(*(long *)text._M_str + 0x20);
      __str_01._M_str = (char *)pbVar1;
      __str_01._M_len = *(size_t *)(*(long *)text._M_str + 0x28);
      std::experimental::fundamentals_v1::operator<<((fundamentals_v1 *)stream,pbVar1,__str_01);
      padding_right = (size_t)__str_02._M_str;
    }
    __str_02._M_len = text._M_len;
    std::experimental::fundamentals_v1::operator<<
              ((fundamentals_v1 *)stream,(basic_ostream<char,_std::char_traits<char>_> *)twidth,
               __str_02);
    local_b0 = uVar2 - local_f0;
    while (stream_local = stream, local_b0 != 0) {
      pbVar1 = *(basic_ostream<char,_std::char_traits<char>_> **)(*(long *)text._M_str + 0x20);
      __str_03._M_str = (char *)pbVar1;
      __str_03._M_len = *(size_t *)(*(long *)text._M_str + 0x28);
      std::experimental::fundamentals_v1::operator<<((fundamentals_v1 *)stream,pbVar1,__str_03);
      local_b0 = local_b0 + -1;
    }
  }
  return stream_local;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, label_line const& line) {
        auto const text = line.label_->text_;
        auto const twidth = utf8_string_width(text);
        auto const width = line.label_->width_;

        if (!width || twidth == width)
            return stream << text;

        if (twidth > width)
            return stream << utf8_clamp(text, width).first;

        std::size_t padding = width - twidth;
        std::size_t padding_left =
            (line.label_->align_ == Align::Center) ? padding / 2 :
                (line.label_->align_ == Align::Right) ? padding : 0;
        std::size_t padding_right = padding - padding_left;

        while (padding_left--)
            stream << line.label_->fill_;

        stream << text;

        while (padding_right--)
            stream << line.label_->fill_;

        return stream;
    }